

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arbitrary_arithmetic.h
# Opt level: O2

float testinator::detail::Arbitrary_Arithmetic_Real<float>::generate
                (size_t generation,unsigned_long randomSeed)

{
  TestRegistry *pTVar1;
  result_type_conflict7 rVar2;
  param_type local_18;
  
  if (generation < 4) {
    return *(float *)(&DAT_00160d40 + generation * 4);
  }
  pTVar1 = TestRegistry::Instance();
  ::std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::seed(&pTVar1->m_generator,randomSeed);
  local_18._M_a = 1.1754944e-38;
  local_18._M_b = 3.4028235e+38;
  rVar2 = ::std::uniform_real_distribution<float>::operator()
                    ((uniform_real_distribution<float> *)&local_18,&pTVar1->m_generator);
  return rVar2;
}

Assistant:

static T generate(std::size_t generation, unsigned long int randomSeed)
      {
        switch (generation)
        {
          case 0:
            return 0;
          case 1:
            return std::numeric_limits<T>::min();
          case 2:
            return std::numeric_limits<T>::max();
          case 3:
            return std::numeric_limits<T>::lowest();

          default:
          {
            std::mt19937& gen = testinator::GetTestRegistry().RNG();
            gen.seed(randomSeed);
            std::uniform_real_distribution<T> dis(
                std::numeric_limits<T>::min(), std::numeric_limits<T>::max());
            return dis(gen);
          }
        }
      }